

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixture_tests.cpp
# Opt level: O0

void TestFixture::TearDownTestCase(void)

{
  bool bVar1;
  char *message;
  AssertionHelper local_200;
  Fixed local_1c0;
  int local_34;
  undefined1 local_30 [8];
  AssertionResult iutest_ar;
  
  iutest::detail::AlwaysZero();
  local_34 = 3;
  iutest::internal::backward::EqHelper<false>::Compare<int>
            ((AssertionResult *)local_30,"3","x",&local_34,&x);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    memset(&local_1c0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1c0);
    message = iutest::AssertionResult::message((AssertionResult *)local_30);
    iutest::AssertionHelper::AssertionHelper
              (&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/fixture_tests.cpp"
               ,0x44,message,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_200,&local_1c0);
    iutest::AssertionHelper::~AssertionHelper(&local_200);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1c0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  if (bVar1) {
    x = -1;
  }
  return;
}

Assistant:

static void TearDownTestCase(void)
    {
        IUTEST_ASSERT_EQ(3, x);
        x = -1;
    }